

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.cpp
# Opt level: O3

InplaceStr GetTemporaryName(ExpressionContext *ctx,uint index,char *suffix)

{
  int iVar1;
  size_t sVar2;
  undefined4 extraout_var;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  byte *pbVar6;
  byte *pbVar7;
  byte *pbVar8;
  InplaceStr IVar9;
  char buf [16];
  byte local_48;
  byte local_47 [23];
  
  uVar5 = (ulong)index;
  local_48 = (char)index + (char)(index / 10) * -10 | 0x30;
  pbVar6 = local_47;
  if (9 < index) {
    do {
      uVar4 = (uint)uVar5;
      uVar3 = uVar5 / 10;
      uVar5 = uVar5 / 10;
      *pbVar6 = (char)uVar5 + (char)(uVar3 * 0x1999999a >> 0x20) * -10 | 0x30;
      pbVar6 = pbVar6 + 1;
    } while (99 < uVar4);
  }
  if (suffix == (char *)0x0) {
    uVar4 = 0;
  }
  else {
    sVar2 = strlen(suffix);
    uVar4 = (uint)sVar2;
  }
  iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)(uVar4 + 0x10));
  IVar9.begin = (byte *)CONCAT44(extraout_var,iVar1);
  IVar9.begin[0] = 0x24;
  IVar9.begin[1] = 0x74;
  IVar9.begin[2] = 0x65;
  IVar9.begin[3] = 0x6d;
  IVar9.begin[4] = 0x70;
  pbVar8 = IVar9.begin + 5;
  do {
    pbVar7 = pbVar8;
    pbVar8 = pbVar6 + -1;
    pbVar6 = pbVar6 + -1;
    *pbVar7 = *pbVar8;
    pbVar8 = pbVar7 + 1;
  } while (pbVar6 != &local_48);
  if (suffix != (char *)0x0) {
    *pbVar8 = 0x5f;
    memcpy(pbVar7 + 2,suffix,(ulong)uVar4);
    pbVar8 = pbVar8 + (ulong)uVar4 + 1;
  }
  *pbVar8 = 0;
  sVar2 = strlen((char *)IVar9.begin);
  if (sVar2 < uVar4 + 0x10) {
    if (IVar9.begin <= pbVar8) {
      IVar9.end = (char *)pbVar8;
      return IVar9;
    }
    __assert_fail("strEnd >= strBegin",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/StrAlgo.h"
                  ,0x28,"InplaceStr::InplaceStr(const char *, const char *)");
  }
  __assert_fail("strlen(name) < nameLength",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                ,0x2ba,
                "InplaceStr GetTemporaryName(ExpressionContext &, unsigned int, const char *)");
}

Assistant:

InplaceStr GetTemporaryName(ExpressionContext &ctx, unsigned index, const char *suffix)
{
	char buf[16];

	char *curr = buf;

	*curr++ = (char)((index % 10) + '0');

	while(index /= 10)
		*curr++ = (char)((index % 10) + '0');

	unsigned suffixLength = suffix ? (unsigned)strlen(suffix) : 0;

	unsigned nameLength = 16 + suffixLength;
	char *name = (char*)ctx.allocator->alloc(nameLength);

	char *pos = name;

	memcpy(pos, "$temp", 5);
	pos += 5;

	do
	{
		--curr;
		*pos++ = *curr;
	}
	while(curr != buf);

	if(suffix)
	{
		*pos++ = '_';

		memcpy(pos, suffix, suffixLength);
		pos += suffixLength;
	}

	*pos = 0;

	assert(strlen(name) < nameLength);
	return InplaceStr(name, pos);
}